

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpotController.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_433838::SpotController::process_timeseries
          (SpotController *this,SpotTimeseriesController *tsc,Caliper *c,CaliWriter *writer,
          LoopInfo *info,Comm *comm)

{
  bool bVar1;
  int iVar2;
  char *__s;
  int *piVar3;
  reference this_00;
  Node *node;
  AggregationOp *extraout_RDX;
  AggregationOp *op_00;
  undefined1 auVar4 [16];
  int local_34c;
  anon_class_32_2_31f4f1ea local_338;
  SnapshotProcessFn local_318;
  undefined1 auStack_2f8 [8];
  Entry entry;
  Variant v_data;
  AggregationOp *op;
  iterator __end4;
  iterator __begin4;
  vector<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_> *__range4;
  string local_288;
  undefined1 local_268 [8];
  Aggregator cross_agg;
  QuerySpec spec;
  undefined1 local_b8 [4];
  int blocksize;
  StringConverter local_98;
  int local_64;
  string local_60 [4];
  int nblocks;
  string name;
  int rec_count;
  int iterations;
  Comm *comm_local;
  LoopInfo *info_local;
  CaliWriter *writer_local;
  Caliper *c_local;
  SpotTimeseriesController *tsc_local;
  SpotController *this_local;
  
  name.field_2._12_4_ = (*comm->_vptr_Comm[3])(comm,(ulong)(uint)info->iterations);
  name.field_2._8_4_ = (*comm->_vptr_Comm[3])(comm,(ulong)(uint)info->count);
  (*comm->_vptr_Comm[4])(local_60,comm,info);
  if (0 < (int)name.field_2._12_4_) {
    local_64 = 0x14;
    bVar1 = cali::ConfigManager::Options::is_set(&this->m_opts,"timeseries.maxrows");
    if (bVar1) {
      cali::ConfigManager::Options::get_abi_cxx11_
                ((string *)local_b8,&this->m_opts,"timeseries.maxrows","");
      cali::StringConverter::StringConverter(&local_98,(string *)local_b8);
      local_64 = cali::StringConverter::to_int(&local_98,(bool *)0x0);
      cali::StringConverter::~StringConverter(&local_98);
      std::__cxx11::string::~string((string *)local_b8);
    }
    if (local_64 < 1) {
      local_64 = name.field_2._8_4_;
    }
    if (local_64 < (int)name.field_2._8_4_) {
      local_34c = (int)name.field_2._12_4_ / local_64;
    }
    else {
      local_34c = 1;
    }
    spec.preprocess_ops.
    super__Vector_base<cali::QuerySpec::PreprocessSpec,_std::allocator<cali::QuerySpec::PreprocessSpec>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = local_34c;
    SpotTimeseriesController::timeseries_spec
              ((QuerySpec *)
               &cross_agg.mP.
                super___shared_ptr<cali::Aggregator::AggregatorImpl,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,tsc);
    cali::Aggregator::Aggregator
              ((Aggregator *)local_268,
               (QuerySpec *)
               &cross_agg.mP.
                super___shared_ptr<cali::Aggregator::AggregatorImpl,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    cali::CaliperMetadataDB::add_attribute_aliases
              (&this->m_db,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&spec.format.kwargs._M_t._M_impl.super__Rb_tree_header._M_node_count);
    cali::CaliperMetadataDB::add_attribute_units
              (&this->m_db,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&spec.aliases._M_t._M_impl.super__Rb_tree_header._M_node_count);
    __s = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_288,__s,(allocator<char> *)((long)&__range4 + 7));
    __range4._0_4_ = 1;
    piVar3 = std::max<int>((int *)((long)&spec.preprocess_ops.
                                          super__Vector_base<cali::QuerySpec::PreprocessSpec,_std::allocator<cali::QuerySpec::PreprocessSpec>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                           (int *)&__range4);
    SpotTimeseriesController::timeseries_local_aggregation
              (tsc,c,&this->m_db,&local_288,*piVar3,(Aggregator *)local_268);
    std::__cxx11::string::~string((string *)&local_288);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range4 + 7));
    (*comm->_vptr_Comm[5])(comm,&this->m_db,local_268);
    iVar2 = (*comm->_vptr_Comm[2])();
    if (iVar2 == 0) {
      std::__cxx11::string::clear();
      __end4 = std::
               vector<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>
               ::begin((vector<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>
                        *)&spec);
      op = (AggregationOp *)
           std::
           vector<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>::
           end((vector<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>
                *)&spec);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<cali::QuerySpec::AggregationOp_*,_std::vector<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>_>
                                         *)&op), bVar1) {
        this_00 = __gnu_cxx::
                  __normal_iterator<cali::QuerySpec::AggregationOp_*,_std::vector<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>_>
                  ::operator*(&__end4);
        auVar4 = std::__cxx11::string::empty();
        op_00 = auVar4._8_8_;
        if ((auVar4 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          std::__cxx11::string::append((char *)&this->m_spot_timeseries_metrics);
          op_00 = extraout_RDX;
        }
        cali::Aggregator::get_aggregation_attribute_name_abi_cxx11_
                  ((string *)&v_data.m_v.value,(Aggregator *)this_00,op_00);
        std::__cxx11::string::append((string *)&this->m_spot_timeseries_metrics);
        std::__cxx11::string::~string((string *)&v_data.m_v.value.v_bool);
        __gnu_cxx::
        __normal_iterator<cali::QuerySpec::AggregationOp_*,_std::vector<cali::QuerySpec::AggregationOp,_std::allocator<cali::QuerySpec::AggregationOp>_>_>
        ::operator++(&__end4);
      }
      cali::Variant::Variant((Variant *)&entry.m_value.m_v.value,"timeseries");
      node = cali::CaliperMetadataDB::make_tree_entry
                       (&this->m_db,1,&this->m_channel_attr,(Variant *)&entry.m_value.m_v.value,
                        (Node *)0x0);
      cali::Entry::Entry((Entry *)auStack_2f8,node);
      local_338.entry.m_value.m_v.value.v_uint = entry.m_value.m_v.type_and_size;
      local_338.entry.m_node = (Node *)auStack_2f8;
      local_338.entry.m_value.m_v.type_and_size = (uint64_t)entry.m_node;
      local_338.writer = writer;
      std::
      function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
      ::
      function<(anonymous_namespace)::SpotController::process_timeseries((anonymous_namespace)::SpotTimeseriesController*,cali::Caliper&,cali::CaliWriter&,(anonymous_namespace)::LoopInfo_const&,cali::internal::CustomOutputController::Comm&)::_lambda(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)_1_,void>
                ((function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
                  *)&local_318,&local_338);
      cali::Aggregator::flush
                ((Aggregator *)local_268,&(this->m_db).super_CaliperMetadataAccessInterface,
                 &local_318);
      std::
      function<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&)>
      ::~function(&local_318);
    }
    cali::Aggregator::~Aggregator((Aggregator *)local_268);
    cali::QuerySpec::~QuerySpec
              ((QuerySpec *)
               &cross_agg.mP.
                super___shared_ptr<cali::Aggregator::AggregatorImpl,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  std::__cxx11::string::~string(local_60);
  return;
}

Assistant:

void process_timeseries(
        SpotTimeseriesController* tsc,
        Caliper&                  c,
        CaliWriter&               writer,
        const LoopInfo&           info,
        Comm&                     comm
    )
    {
        int         iterations = comm.bcast_int(info.iterations);
        int         rec_count  = comm.bcast_int(info.count);
        std::string name       = comm.bcast_str(info.name);

        if (iterations > 0) {
            int nblocks = 20;

            if (m_opts.is_set("timeseries.maxrows"))
                nblocks = StringConverter(m_opts.get("timeseries.maxrows")).to_int();
            if (nblocks <= 0)
                nblocks = rec_count;

            int blocksize = rec_count > nblocks ? iterations / nblocks : 1;

            QuerySpec  spec = tsc->timeseries_spec();
            Aggregator cross_agg(spec);

            m_db.add_attribute_aliases(spec.aliases);
            m_db.add_attribute_units(spec.units);

            tsc->timeseries_local_aggregation(c, m_db, name.c_str(), std::max(blocksize, 1), cross_agg);
            comm.cross_aggregate(m_db, cross_agg);

            if (comm.rank() == 0) {
                // --- Save the timeseries metrics. Should be the same for each
                //   loop, so just clear them before setting them.
                m_spot_timeseries_metrics.clear();

                for (const auto& op : spec.aggregate.list) {
                    if (!m_spot_timeseries_metrics.empty())
                        m_spot_timeseries_metrics.append(",");

                    m_spot_timeseries_metrics.append(Aggregator::get_aggregation_attribute_name(op));
                }

                Variant v_data("timeseries");
                Entry   entry(m_db.make_tree_entry(1, &m_channel_attr, &v_data));

                // --- Write data
                cross_agg.flush(
                    m_db,
                    [&writer, entry](CaliperMetadataAccessInterface& in_db, const std::vector<Entry>& rec) {
                        writer.write_snapshot(in_db, augment_vector(rec, { entry }));
                    }
                );
            }
        }
    }